

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O1

int main(void)

{
  undefined1 local_21;
  undefined8 *local_20;
  code *local_18;
  long local_10;
  
  te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Circle,0ul>
            ((poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *)&local_20,&local_21);
  (*(code *)*local_20)(local_10,&std::cout);
  if (local_10 != 0) {
    (*local_18)();
  }
  local_10 = 0;
  if (local_20 != (undefined8 *)0x0) {
    operator_delete__(local_20);
  }
  te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Square,0ul>
            ((poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *)&local_20,&local_21);
  (*(code *)*local_20)(local_10,&std::cout);
  if (local_10 != 0) {
    (*local_18)();
  }
  local_10 = 0;
  if (local_20 != (undefined8 *)0x0) {
    operator_delete__(local_20);
  }
  return 0;
}

Assistant:

int main() {
  draw(Circle{});  // prints Circle
  draw(Square{});  // prints Square
}